

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O3

void __thiscall
dynamicgraph::SignalTimeDependent<double,int>::access(SignalTimeDependent<double,int> *this)

{
  int in_EDX;
  char *in_RSI;
  
  SignalTimeDependent<double,_int>::access
            ((SignalTimeDependent<double,_int> *)(this + *(long *)(*(long *)this + -0xf0)),in_RSI,
             in_EDX);
  return;
}

Assistant:

const T &SignalTimeDependent<T, Time>::access(const Time &t1) {
  const bool up = TimeDependency<Time>::needUpdate(t1);
  // SignalBase<Time>::setReady(false);

  /*       std::cout << "Time before: "<< signalTime << " -- "   */
  /*            << t1<< "  -> Up: "<<up <<std::endl ;   */
  if (up) {
    TimeDependency<Time>::lastAskForUpdate = false;
    const T &Tres = Signal<T, Time>::access(t1);
    SignalBase<Time>::setReady(false);
    return Tres;
  } else {
    return Signal<T, Time>::accessCopy();
  }
}